

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O0

void __thiscall
Liby::EventLoopGroup::run::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  Logger *this_00;
  double __x;
  anon_class_1_0_00000001 *this_local;
  
  this_00 = Logger::getLogger();
  Logger::log(this_00,__x);
  return;
}

Assistant:

void EventLoopGroup::run(BoolFunctor bf) {
    Signal::signal(SIGPIPE, [] { error("receive SIGPIPE"); });

    bf_ = bf;
    for (int i = 0; i < n_; i++) {
        threads_.emplace_back([this](int index) { worker_thread(index); },
                              i + 1);
    }

    worker_thread(0);
}